

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_92e1f6::HandleAppendCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  string *psVar2;
  ulong uVar3;
  string *name;
  string_view value;
  string_view initial;
  string newValue;
  string local_50;
  cmStringRange local_30;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar3 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  if (uVar3 < 0x21) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"sub-command APPEND requires at least one argument.",
               (allocator<char> *)&local_30);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else {
    if (uVar3 == 0x40) goto LAB_00269e5d;
    name = pbVar1 + 1;
    psVar2 = cmMakefile::GetSafeDefinition(status->Makefile,name);
    local_30.End._M_current =
         (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    local_30.Begin._M_current =
         (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start + 2;
    initial._M_str = (psVar2->_M_dataplus)._M_p;
    initial._M_len = psVar2->_M_string_length;
    cmJoin(&local_50,&local_30,(string_view)ZEXT816(0),initial);
    value._M_str = local_50._M_dataplus._M_p;
    value._M_len = local_50._M_string_length;
    cmMakefile::AddDefinition(status->Makefile,name,value);
  }
  std::__cxx11::string::~string((string *)&local_50);
LAB_00269e5d:
  return 0x20 < uVar3;
}

Assistant:

bool HandleAppendCommand(std::vector<std::string> const& args,
                         cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("sub-command APPEND requires at least one argument.");
    return false;
  }

  // Skip if nothing to append.
  if (args.size() < 3) {
    return true;
  }

  auto const& variableName = args[1];

  cm::string_view oldView{ status.GetMakefile().GetSafeDefinition(
    variableName) };

  auto const newValue = cmJoin(cmMakeRange(args).advance(2), {}, oldView);
  status.GetMakefile().AddDefinition(variableName, newValue);

  return true;
}